

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O1

void destroy_async_data(Curl_async *async)

{
  int iVar1;
  pthread_t **hnd;
  thread_data *td;
  
  hnd = (pthread_t **)async->os_specific;
  if (hnd != (pthread_t **)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)hnd[3]);
    iVar1 = *(int *)(hnd + 4);
    *(undefined4 *)(hnd + 4) = 1;
    pthread_mutex_unlock((pthread_mutex_t *)hnd[3]);
    if (iVar1 == 0) {
      Curl_thread_destroy(*hnd);
    }
    else {
      if (*hnd != (pthread_t *)0x0) {
        Curl_thread_join(hnd);
      }
      destroy_thread_sync_data((thread_sync_data *)(hnd + 3));
      (*Curl_cfree)(async->os_specific);
    }
  }
  async->os_specific = (void *)0x0;
  (*Curl_cfree)(async->hostname);
  async->hostname = (char *)0x0;
  return;
}

Assistant:

static void destroy_async_data(struct Curl_async *async)
{
  if(async->os_specific) {
    struct thread_data *td = (struct thread_data*) async->os_specific;
    int done;

    /*
     * if the thread is still blocking in the resolve syscall, detach it and
     * let the thread do the cleanup...
     */
    Curl_mutex_acquire(td->tsd.mtx);
    done = td->tsd.done;
    td->tsd.done = 1;
    Curl_mutex_release(td->tsd.mtx);

    if(!done) {
      Curl_thread_destroy(td->thread_hnd);
    }
    else {
      if(td->thread_hnd != curl_thread_t_null)
        Curl_thread_join(&td->thread_hnd);

      destroy_thread_sync_data(&td->tsd);

      free(async->os_specific);
    }
  }
  async->os_specific = NULL;

  free(async->hostname);
  async->hostname = NULL;
}